

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

uint Ga2_ObjComputeTruthSpecial(Gia_Man_t *p,Gia_Obj_t *pRoot,Vec_Int_t *vLeaves,Vec_Int_t *vLits)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  int pUsed [5];
  uint local_58 [6];
  Vec_Int_t *local_40;
  Gia_Obj_t *local_38;
  
  local_38 = pRoot;
  if (((int)(uint)*(undefined8 *)pRoot < 0) ||
     (((uint)*(undefined8 *)pRoot & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                  ,0x208,
                  "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  iVar18 = vLeaves->nSize;
  if (0 < (long)iVar18) {
    piVar4 = vLeaves->pArray;
    lVar9 = 0;
    puVar12 = Ga2_ManComputeTruth::uTruth5;
    do {
      iVar2 = piVar4[lVar9];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_005f4133;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (vLits->nSize <= lVar9) goto LAB_005f4114;
      uVar7 = vLits->pArray[lVar9];
      if ((int)uVar7 < 0) {
        __assert_fail("Entry >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x211,
                      "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (uVar7 != 0) {
        if (uVar7 == 1) {
          uVar7 = 0xffffffff;
        }
        else {
          uVar7 = *puVar12;
        }
      }
      p->pObjs[iVar2].Value = uVar7;
      lVar9 = lVar9 + 1;
      puVar12 = puVar12 + 1;
    } while (iVar18 != lVar9);
  }
  uVar7 = Ga2_ObjComputeTruth_rec(p,pRoot,1);
  if (uVar7 - 1 < 0xfffffffe) {
    local_40 = vLeaves;
    iVar18 = vLeaves->nSize;
    uVar13 = (ulong)iVar18;
    if ((long)uVar13 < 1) {
      uVar17 = 0;
    }
    else {
      uVar8 = 0;
      puVar12 = &Ga2_ObjTruthDepends_uInvTruth5;
      uVar17 = 0;
      do {
        if (uVar8 == 5) goto LAB_005f4152;
        if ((*puVar12 & (uVar7 >> ((byte)(1 << ((byte)uVar8 & 0x1f)) & 0x1f) ^ uVar7)) != 0) {
          lVar9 = (long)(int)uVar17;
          uVar17 = uVar17 + 1;
          local_58[lVar9] = (uint)uVar8;
        }
        uVar8 = uVar8 + 1;
        puVar12 = puVar12 + 1;
      } while (uVar13 != uVar8);
    }
    if ((int)uVar17 < 1) {
      __assert_fail("nUsed > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                    ,0x22c,
                    "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if (uVar17 != 1) {
      uVar10 = 1;
      uVar8 = 0;
      do {
        uVar1 = uVar8 + 1;
        uVar16 = uVar8 & 0xffffffff;
        uVar14 = uVar10;
        do {
          uVar7 = local_58[uVar14];
          if (((long)(int)uVar7 < 0) || (vLits->nSize <= (int)uVar7)) goto LAB_005f4114;
          uVar11 = local_58[(int)uVar16];
          if (((long)(int)uVar11 < 0) || (vLits->nSize <= (int)uVar11)) goto LAB_005f4114;
          uVar6 = uVar14 & 0xffffffff;
          if (vLits->pArray[(int)uVar11] <= vLits->pArray[(int)uVar7]) {
            uVar6 = uVar16;
          }
          uVar16 = uVar6;
          uVar14 = uVar14 + 1;
        } while (uVar17 != uVar14);
        uVar7 = local_58[uVar8];
        local_58[uVar8] = local_58[(int)uVar16];
        local_58[(int)uVar16] = uVar7;
        uVar10 = uVar10 + 1;
        uVar8 = uVar1;
      } while (uVar1 != uVar17 - 1);
    }
    if ((-1 < (long)(int)local_58[0]) && (uVar7 = vLits->nSize, (int)local_58[0] < (int)uVar7)) {
      uVar11 = local_58[uVar17 - 1];
      if ((-1 < (long)(int)uVar11) && ((int)uVar11 < (int)uVar7)) {
        piVar4 = vLits->pArray;
        if (piVar4[(int)uVar11] < piVar4[(int)local_58[0]]) {
          __assert_fail("Vec_IntEntry(vLits, pUsed[0]) <= Vec_IntEntry(vLits, pUsed[nUsed-1])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                        ,0x22f,
                        "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        if (0 < iVar18) {
          piVar5 = local_40->pArray;
          uVar8 = 0;
          uVar10 = 0;
          if (0 < (int)uVar7) {
            uVar10 = (ulong)uVar7;
          }
          do {
            iVar2 = piVar5[uVar8];
            if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_005f4133;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            if (uVar10 == uVar8) goto LAB_005f4114;
            iVar3 = piVar4[uVar8];
            if (iVar3 < 0) {
              __assert_fail("Entry >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                            ,0x234,
                            "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            uVar11 = -(uint)(iVar3 == 1) | 0xdeadcafe;
            if (iVar3 == 0) {
              uVar11 = 0;
            }
            p->pObjs[iVar2].Value = uVar11;
            uVar8 = uVar8 + 1;
          } while (uVar13 != uVar8);
        }
        puVar12 = &Ga2_ObjTruthDepends_uInvTruth5;
        uVar13 = 1;
        if (1 < (int)uVar17) {
          uVar13 = (ulong)uVar17;
        }
        lVar9 = 0;
        do {
          iVar2 = *(int *)((long)local_58 + lVar9);
          lVar15 = (long)iVar2;
          if ((lVar15 < 0) || ((int)uVar7 <= iVar2)) goto LAB_005f4114;
          uVar11 = piVar4[lVar15];
          if ((int)uVar11 < 2) {
            __assert_fail("Entry > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                          ,0x23f,
                          "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          if (iVar18 <= iVar2) goto LAB_005f4114;
          iVar2 = local_40->pArray[lVar15];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_005f4133;
          p->pObjs[iVar2].Value =
               -(uVar11 & 1) ^ *(uint *)((long)Ga2_ManComputeTruth::uTruth5 + lVar9);
          *(uint *)((long)local_58 + lVar9) = uVar11 & 0x7ffffffe;
          lVar9 = lVar9 + 4;
        } while (uVar13 * 4 != lVar9);
        uVar7 = Ga2_ObjComputeTruth_rec(p,local_38,1);
        vLits->nSize = 0;
        uVar13 = (ulong)uVar17;
        if ((int)uVar17 < 2) {
          uVar13 = 1;
        }
        uVar8 = 1;
        do {
          uVar10 = uVar8;
          Vec_IntPush(vLits,local_58[uVar10 - 1]);
          if (uVar10 == 6) {
LAB_005f4152:
            __assert_fail("v >= 0 && v <= 4",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                          ,0x1fd,"unsigned int Ga2_ObjTruthDepends(unsigned int, int)");
          }
          if ((*puVar12 & (uVar7 >> ((byte)(1 << ((char)uVar10 - 1U & 0x1f)) & 0x1f) ^ uVar7)) == 0)
          {
            __assert_fail("Ga2_ObjTruthDepends(Res, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                          ,0x24e,
                          "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          puVar12 = puVar12 + 1;
          uVar8 = uVar10 + 1;
        } while (uVar10 != uVar13);
        vLeaves = local_40;
        uVar13 = uVar10 + 1;
        if (uVar10 - 1 < 4) {
          do {
            if ((*puVar12 & (uVar7 >> ((byte)(1 << ((char)uVar13 - 1U & 0x1f)) & 0x1f) ^ uVar7)) !=
                0) {
              __assert_fail("!Ga2_ObjTruthDepends(Res, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                            ,0x253,
                            "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            puVar12 = puVar12 + 1;
            iVar18 = (int)uVar13;
            uVar13 = uVar13 + 1;
          } while (iVar18 != 5);
        }
        goto LAB_005f40c6;
      }
    }
LAB_005f4114:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_005f40c6:
  iVar18 = vLeaves->nSize;
  if (0 < (long)iVar18) {
    piVar4 = vLeaves->pArray;
    lVar9 = 0;
    do {
      iVar2 = piVar4[lVar9];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_005f4133:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return uVar7;
      }
      p->pObjs[iVar2].Value = 0;
      lVar9 = lVar9 + 1;
    } while (iVar18 != lVar9);
  }
  return uVar7;
}

Assistant:

unsigned Ga2_ObjComputeTruthSpecial( Gia_Man_t * p, Gia_Obj_t * pRoot, Vec_Int_t * vLeaves, Vec_Int_t * vLits )
{
    int fVerbose = 0;
    static unsigned uTruth5[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned Res;
    Gia_Obj_t * pObj;
    int i, Entry;
//    int Id = Gia_ObjId(p, pRoot);
    assert( Gia_ObjIsAnd(pRoot) );

    if ( fVerbose )
    printf( "Object %d.\n", Gia_ObjId(p, pRoot) );

    // assign elementary truth tables
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
    {
        Entry = Vec_IntEntry( vLits, i );
        assert( Entry >= 0 );
        if ( Entry == 0 )
            pObj->Value = 0;
        else if ( Entry == 1 )
            pObj->Value = ~0;
        else // non-trivial literal
            pObj->Value = uTruth5[i];
        if ( fVerbose )
        printf( "%d ", Entry );
    }

    if ( fVerbose )
    {
    Res = Ga2_ObjTruth( p, pRoot );
//    Kit_DsdPrintFromTruth( &Res, Vec_IntSize(vLeaves) );
    printf( "\n" );
    }

    // compute truth table
    Res = Ga2_ObjComputeTruth_rec( p, pRoot, 1 );
    if ( Res != 0 && Res != ~0 )
    {
        // find essential variables
        int nUsed = 0, pUsed[5];
        for ( i = 0; i < Vec_IntSize(vLeaves); i++ )
            if ( Ga2_ObjTruthDepends( Res, i ) )
                pUsed[nUsed++] = i;
        assert( nUsed > 0 );
        // order positions by literal value
        Vec_IntSelectSortCost( pUsed, nUsed, vLits );
        assert( Vec_IntEntry(vLits, pUsed[0]) <= Vec_IntEntry(vLits, pUsed[nUsed-1]) );
        // assign elementary truth tables to the leaves
        Gia_ManForEachObjVec( vLeaves, p, pObj, i )
        {
            Entry = Vec_IntEntry( vLits, i );
            assert( Entry >= 0 );
            if ( Entry == 0 )
                pObj->Value = 0;
            else if ( Entry == 1 )
                pObj->Value = ~0;
            else // non-trivial literal
                pObj->Value = 0xDEADCAFE; // not important
        }
        for ( i = 0; i < nUsed; i++ )
        {
            Entry = Vec_IntEntry( vLits, pUsed[i] );
            assert( Entry > 1 );
            pObj = Gia_ManObj( p, Vec_IntEntry(vLeaves, pUsed[i]) );
            pObj->Value = Abc_LitIsCompl(Entry) ? ~uTruth5[i] : uTruth5[i];
//            pObj->Value = uTruth5[i];
            // remember this literal
            pUsed[i] = Abc_LitRegular(Entry);
//            pUsed[i] = Entry;
        }
        // compute truth table
        Res = Ga2_ObjComputeTruth_rec( p, pRoot, 1 );
        // reload the literals
        Vec_IntClear( vLits );
        for ( i = 0; i < nUsed; i++ )
        {
            Vec_IntPush( vLits, pUsed[i] );
            assert( Ga2_ObjTruthDepends(Res, i) );
            if ( fVerbose )
            printf( "%d ", pUsed[i] );
        }
        for ( ; i < 5; i++ )
            assert( !Ga2_ObjTruthDepends(Res, i) );

if ( fVerbose )
{
//    Kit_DsdPrintFromTruth( &Res, nUsed );
    printf( "\n" );
}

    }
    else
    {

if ( fVerbose )
{
    Vec_IntClear( vLits );
    printf( "Const %d\n", Res > 0 );
}

    }
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
        pObj->Value = 0;
    return Res;
}